

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Target.cpp
# Opt level: O0

uint32_t __thiscall SCSI::Target::CommandState::address(CommandState *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  size_type sVar4;
  byte *pbVar5;
  CommandState *this_local;
  
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this->data_);
  if (sVar4 == 6) {
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this->data_,1);
    bVar1 = *pbVar5;
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this->data_,2);
    bVar2 = *pbVar5;
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this->data_,3);
    this_local._4_4_ = (uint)bVar1 << 0x10 | (uint)bVar2 << 8 | (uint)*pbVar5;
  }
  else if ((sVar4 == 10) || (sVar4 == 0xc)) {
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this->data_,1);
    bVar1 = *pbVar5;
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this->data_,2);
    bVar2 = *pbVar5;
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this->data_,3);
    bVar3 = *pbVar5;
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this->data_,4);
    this_local._4_4_ = (uint)bVar1 << 0x18 | (uint)bVar2 << 0x10 | (uint)bVar3 << 8 | (uint)*pbVar5;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CommandState::address() const {
	switch(data_.size()) {
		default:	return 0;
		case 6:
			return
				(uint32_t(data_[1]) << 16) |
				(uint32_t(data_[2]) << 8) |
				uint32_t(data_[3]);
		case 10:
		case 12:
			return
				(uint32_t(data_[1]) << 24) |
				(uint32_t(data_[2]) << 16) |
				(uint32_t(data_[3]) << 8) |
				uint32_t(data_[4]);
	}
}